

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QPersistentModelIndex>::reallocate
          (QMovableArrayOps<QPersistentModelIndex> *this,qsizetype alloc,AllocationOption option)

{
  undefined1 auVar1 [16];
  
  auVar1 = QArrayData::reallocateUnaligned
                     (&((this->super_QGenericArrayOps<QPersistentModelIndex>).
                        super_QArrayDataPointer<QPersistentModelIndex>.d)->super_QArrayData,
                      (this->super_QGenericArrayOps<QPersistentModelIndex>).
                      super_QArrayDataPointer<QPersistentModelIndex>.ptr,8,alloc,option);
  if (auVar1._8_8_ != 0) {
    (this->super_QGenericArrayOps<QPersistentModelIndex>).
    super_QArrayDataPointer<QPersistentModelIndex>.d = (Data *)auVar1._0_8_;
    (this->super_QGenericArrayOps<QPersistentModelIndex>).
    super_QArrayDataPointer<QPersistentModelIndex>.ptr = (QPersistentModelIndex *)auVar1._8_8_;
    return;
  }
  qBadAlloc();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }